

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O1

void __thiscall LTChannel::SetValid(LTChannel *this,bool _valid,bool bMsg)

{
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,_valid) == 0) {
    this->bValid = false;
    if (bMsg) {
      if ((int)dataRefs.iLogLevel < 5) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0xe0,"SetValid",logFATAL,"%s: Channel invalid",this->pszChName);
      }
      CreateMsgWindow(12.0,logFATAL,"%s: Channel invalid",this->pszChName);
      return;
    }
  }
  else {
    if (((this->bValid == false) && (bMsg)) && ((int)dataRefs.iLogLevel < 2)) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
             ,0xd8,"SetValid",logINFO,"%s: Channel restarted",this->pszChName);
    }
    this->errCnt = 0;
    this->bValid = true;
  }
  return;
}

Assistant:

void LTChannel::SetValid (bool _valid, bool bMsg)
{
    // (re)set to valid channel
    if (_valid) {
        if (!bValid && bMsg) {
            LOG_MSG(logINFO, INFO_CH_RESTART, ChName());
        }
        errCnt = 0;
        bValid = true;
    } else {
        // set invalid
        bValid = false;
        if (bMsg)
            SHOW_MSG(logFATAL,ERR_CH_INVALID,ChName());
    }
}